

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::TimingControlSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0xbe) {
    if ((kind - CycleDelay < 0x1a) && ((0x3000001U >> (kind - CycleDelay & 0x1f) & 1) != 0)) {
      return true;
    }
  }
  else if ((((kind - EventControl < 0x38) &&
            ((0x80000000000003U >> ((ulong)(kind - EventControl) & 0x3f) & 1) != 0)) ||
           (kind == OneStepDelay)) || (kind == RepeatedEventControl)) {
    return true;
  }
  return false;
}

Assistant:

bool TimingControlSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CycleDelay:
        case SyntaxKind::Delay3:
        case SyntaxKind::DelayControl:
        case SyntaxKind::EventControl:
        case SyntaxKind::EventControlWithExpression:
        case SyntaxKind::ImplicitEventControl:
        case SyntaxKind::OneStepDelay:
        case SyntaxKind::RepeatedEventControl:
            return true;
        default:
            return false;
    }
}